

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O1

AMQP_VALUE amqpvalue_create_long(int64_t value)

{
  undefined4 *puVar1;
  LOGGER_LOG p_Var2;
  AMQP_VALUE pAVar3;
  
  puVar1 = (undefined4 *)malloc(0x20);
  if (puVar1 == (undefined4 *)0x0) {
    pAVar3 = (AMQP_VALUE)0x0;
  }
  else {
    pAVar3 = (AMQP_VALUE)(puVar1 + 2);
    *puVar1 = 1;
  }
  if (pAVar3 == (AMQP_VALUE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
                ,"amqpvalue_create_long",0x28a,1,"Could not allocate memory for AMQP value");
    }
  }
  else {
    pAVar3->type = AMQP_TYPE_LONG;
    (pAVar3->value).long_value = value;
  }
  return pAVar3;
}

Assistant:

AMQP_VALUE amqpvalue_create_long(int64_t value)
{
    AMQP_VALUE result = REFCOUNT_TYPE_CREATE(AMQP_VALUE_DATA);
    if (result == NULL)
    {
        /* Codes_SRS_AMQPVALUE_01_074: [If allocating the AMQP_VALUE fails then amqpvalue_create_long shall return NULL.] */
        LogError("Could not allocate memory for AMQP value");
    }
    else
    {
        /* Codes_SRS_AMQPVALUE_01_073: [amqpvalue_create_long shall return a handle to an AMQP_VALUE that stores an int64_t value.] */
        result->type = AMQP_TYPE_LONG;
        result->value.long_value = value;
    }

    return result;
}